

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

void * mfsteal(mFILE *mf,size_t *size_out)

{
  char *pcVar1;
  
  if (mf == (mFILE *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = mf->data;
    if (size_out != (size_t *)0x0) {
      *size_out = mf->size;
    }
    mfdetach(mf);
    mf->data = (char *)0x0;
    mfdestroy(mf);
  }
  return pcVar1;
}

Assistant:

void *mfsteal(mFILE *mf, size_t *size_out) {
    void *data;

    if (!mf) return NULL;

    data = mf->data;
    
    if (NULL != size_out) *size_out = mf->size;

    mfdetach(mf);
    mf->data = NULL;
    mfdestroy(mf);

    return data;
}